

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sglrReferenceContext.cpp
# Opt level: O1

void __thiscall
sglr::ReferenceContext::texSubImage3D
          (ReferenceContext *this,deUint32 target,int level,int xoffset,int yoffset,int zoffset,
          int width,int height,int depth,deUint32 format,deUint32 type,void *data)

{
  DataBuffer *pDVar1;
  pointer puVar2;
  TextureFormat *pTVar3;
  long lVar4;
  long lVar5;
  pointer puVar6;
  pointer pTVar7;
  Texture1D *pTVar8;
  Texture2D *pTVar9;
  TextureCube *pTVar10;
  Texture3D *pTVar11;
  Texture2DArray *pTVar12;
  TextureCubeArray *pTVar13;
  PixelBufferAccess dst;
  TextureFormat transferFmt;
  ConstPixelBufferAccess src;
  PixelBufferAccess local_58;
  
  if ((-1 < (yoffset | xoffset | zoffset)) && (-1 < (height | width | depth))) {
    pTVar7 = (this->m_textureUnits).
             super__Vector_base<sglr::ReferenceContext::TextureUnit,_std::allocator<sglr::ReferenceContext::TextureUnit>_>
             ._M_impl.super__Vector_impl_data._M_start + this->m_activeTexture;
    transferFmt = glu::mapGLTransferFormat(format,type);
    if ((transferFmt.order == CHANNELORDER_LAST) || (transferFmt.type == CHANNELTYPE_LAST)) {
LAB_018d5bd6:
      if (this->m_lastError != 0) {
        return;
      }
      this->m_lastError = 0x500;
      return;
    }
    pDVar1 = this->m_pixelUnpackBufferBinding;
    if (pDVar1 != (DataBuffer *)0x0) {
      puVar2 = (pDVar1->m_data).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
               _M_impl.super__Vector_impl_data._M_start;
      puVar6 = (pointer)0x0;
      if (puVar2 != (pDVar1->m_data).
                    super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                    super__Vector_impl_data._M_finish) {
        puVar6 = puVar2;
      }
      data = (void *)((long)data + (long)puVar6);
    }
    getUnpack3DAccess(&src,this,&transferFmt,width,height,depth,data);
    if (target == 0xde1) {
      pTVar9 = &pTVar7->default2DTex;
      if (pTVar7->tex2DBinding != (Texture2D *)0x0) {
        pTVar9 = pTVar7->tex2DBinding;
      }
      if ((0xd < (uint)level) ||
         (*(long *)((long)((pTVar9->m_levels).m_data + (uint)level) + 8) == 0)) goto LAB_018d5cf0;
      pTVar3 = (TextureFormat *)((pTVar9->m_levels).m_access + (uint)level);
      dst.super_ConstPixelBufferAccess.m_format = *pTVar3;
      lVar4 = 0;
      do {
        dst.super_ConstPixelBufferAccess.m_size.m_data[lVar4] =
             *(int *)((long)((pTVar9->m_levels).m_access + (uint)level) + 8U + lVar4 * 4);
        lVar4 = lVar4 + 1;
      } while (lVar4 != 3);
      lVar4 = 0;
      do {
        dst.super_ConstPixelBufferAccess.m_pitch.m_data[lVar4] =
             *(int *)((long)((pTVar9->m_levels).m_access + (uint)level) + 0x14U + lVar4 * 4);
        lVar4 = lVar4 + 1;
      } while (lVar4 != 3);
    }
    else if ((target == 0xde0) &&
            (((this->m_limits).contextType.super_ApiType.m_bits & 0x300) == 0x100)) {
      pTVar8 = &pTVar7->default1DTex;
      if (pTVar7->tex1DBinding != (Texture1D *)0x0) {
        pTVar8 = pTVar7->tex1DBinding;
      }
      if ((0xd < (uint)level) ||
         (*(long *)((long)((pTVar8->m_levels).m_data + (uint)level) + 8) == 0)) goto LAB_018d5cf0;
      pTVar3 = (TextureFormat *)((pTVar8->m_levels).m_access + (uint)level);
      dst.super_ConstPixelBufferAccess.m_format = *pTVar3;
      lVar4 = 0;
      do {
        dst.super_ConstPixelBufferAccess.m_size.m_data[lVar4] =
             *(int *)((long)((pTVar8->m_levels).m_access + (uint)level) + 8U + lVar4 * 4);
        lVar4 = lVar4 + 1;
      } while (lVar4 != 3);
      lVar4 = 0;
      do {
        dst.super_ConstPixelBufferAccess.m_pitch.m_data[lVar4] =
             *(int *)((long)((pTVar8->m_levels).m_access + (uint)level) + 0x14U + lVar4 * 4);
        lVar4 = lVar4 + 1;
      } while (lVar4 != 3);
    }
    else if (target - 0x8515 < 6) {
      pTVar10 = &pTVar7->defaultCubeTex;
      if (pTVar7->texCubeBinding != (TextureCube *)0x0) {
        pTVar10 = pTVar7->texCubeBinding;
      }
      lVar4 = 6;
      if ((ushort)(target + 0x7aeb) < 6) {
        lVar4 = *(long *)(&DAT_01cf7258 + (ulong)(target + 0x7aeb & 0xffff) * 8);
      }
      if ((0xd < (uint)level) ||
         (*(long *)((long)(pTVar10->m_levels[lVar4].m_data + (uint)level) + 8) == 0))
      goto LAB_018d5cf0;
      pTVar3 = (TextureFormat *)(pTVar10->m_levels[lVar4].m_access + (uint)level);
      dst.super_ConstPixelBufferAccess.m_format = *pTVar3;
      lVar5 = 0;
      do {
        dst.super_ConstPixelBufferAccess.m_size.m_data[lVar5] =
             *(int *)((long)(pTVar10->m_levels[lVar4].m_access + (uint)level) + 8U + lVar5 * 4);
        lVar5 = lVar5 + 1;
      } while (lVar5 != 3);
      lVar5 = 0;
      do {
        dst.super_ConstPixelBufferAccess.m_pitch.m_data[lVar5] =
             *(int *)((long)(pTVar10->m_levels[lVar4].m_access + (uint)level) + 0x14U + lVar5 * 4);
        lVar5 = lVar5 + 1;
      } while (lVar5 != 3);
    }
    else if (target == 0x9009) {
      pTVar13 = &pTVar7->defaultCubeArrayTex;
      if (pTVar7->texCubeArrayBinding != (TextureCubeArray *)0x0) {
        pTVar13 = pTVar7->texCubeArrayBinding;
      }
      if ((0xd < (uint)level) ||
         (*(long *)((long)((pTVar13->m_levels).m_data + (uint)level) + 8) == 0)) goto LAB_018d5cf0;
      pTVar3 = (TextureFormat *)((pTVar13->m_levels).m_access + (uint)level);
      dst.super_ConstPixelBufferAccess.m_format = *pTVar3;
      lVar4 = 0;
      do {
        dst.super_ConstPixelBufferAccess.m_size.m_data[lVar4] =
             *(int *)((long)((pTVar13->m_levels).m_access + (uint)level) + 8U + lVar4 * 4);
        lVar4 = lVar4 + 1;
      } while (lVar4 != 3);
      lVar4 = 0;
      do {
        dst.super_ConstPixelBufferAccess.m_pitch.m_data[lVar4] =
             *(int *)((long)((pTVar13->m_levels).m_access + (uint)level) + 0x14U + lVar4 * 4);
        lVar4 = lVar4 + 1;
      } while (lVar4 != 3);
    }
    else if (target == 0x8c1a) {
      pTVar12 = &pTVar7->default2DArrayTex;
      if (pTVar7->tex2DArrayBinding != (Texture2DArray *)0x0) {
        pTVar12 = pTVar7->tex2DArrayBinding;
      }
      if ((0xd < (uint)level) ||
         (*(long *)((long)((pTVar12->m_levels).m_data + (uint)level) + 8) == 0)) goto LAB_018d5cf0;
      pTVar3 = (TextureFormat *)((pTVar12->m_levels).m_access + (uint)level);
      dst.super_ConstPixelBufferAccess.m_format = *pTVar3;
      lVar4 = 0;
      do {
        dst.super_ConstPixelBufferAccess.m_size.m_data[lVar4] =
             *(int *)((long)((pTVar12->m_levels).m_access + (uint)level) + 8U + lVar4 * 4);
        lVar4 = lVar4 + 1;
      } while (lVar4 != 3);
      lVar4 = 0;
      do {
        dst.super_ConstPixelBufferAccess.m_pitch.m_data[lVar4] =
             *(int *)((long)((pTVar12->m_levels).m_access + (uint)level) + 0x14U + lVar4 * 4);
        lVar4 = lVar4 + 1;
      } while (lVar4 != 3);
    }
    else {
      if (target != 0x806f) goto LAB_018d5bd6;
      pTVar11 = &pTVar7->default3DTex;
      if (pTVar7->tex3DBinding != (Texture3D *)0x0) {
        pTVar11 = pTVar7->tex3DBinding;
      }
      if ((0xd < (uint)level) ||
         (*(long *)((long)((pTVar11->m_levels).m_data + (uint)level) + 8) == 0)) goto LAB_018d5cf0;
      pTVar3 = (TextureFormat *)((pTVar11->m_levels).m_access + (uint)level);
      dst.super_ConstPixelBufferAccess.m_format = *pTVar3;
      lVar4 = 0;
      do {
        dst.super_ConstPixelBufferAccess.m_size.m_data[lVar4] =
             *(int *)((long)((pTVar11->m_levels).m_access + (uint)level) + 8U + lVar4 * 4);
        lVar4 = lVar4 + 1;
      } while (lVar4 != 3);
      lVar4 = 0;
      do {
        dst.super_ConstPixelBufferAccess.m_pitch.m_data[lVar4] =
             *(int *)((long)((pTVar11->m_levels).m_access + (uint)level) + 0x14U + lVar4 * 4);
        lVar4 = lVar4 + 1;
      } while (lVar4 != 3);
    }
    dst.super_ConstPixelBufferAccess.m_data = *(void **)(pTVar3 + 4);
    if (((width + xoffset <= dst.super_ConstPixelBufferAccess.m_size.m_data[0]) &&
        (height + yoffset <= dst.super_ConstPixelBufferAccess.m_size.m_data[1])) &&
       (depth + zoffset <= dst.super_ConstPixelBufferAccess.m_size.m_data[2])) {
      if ((dst.super_ConstPixelBufferAccess.m_format.order != DS) &&
         (dst.super_ConstPixelBufferAccess.m_format.order != D)) {
        tcu::getSubregion(&local_58,&dst,xoffset,yoffset,zoffset,width,height,depth);
        tcu::copy((EVP_PKEY_CTX *)&local_58,(EVP_PKEY_CTX *)&src);
        return;
      }
      tcu::getSubregion(&local_58,&dst,xoffset,yoffset,zoffset,width,height,depth);
      depthValueFloatClampCopy(&local_58,&src);
      return;
    }
  }
LAB_018d5cf0:
  if (this->m_lastError == 0) {
    this->m_lastError = 0x501;
  }
  return;
}

Assistant:

void ReferenceContext::texSubImage3D (deUint32 target, int level, int xoffset, int yoffset, int zoffset, int width, int height, int depth, deUint32 format, deUint32 type, const void* data)
{
	TextureUnit& unit = m_textureUnits[m_activeTexture];

	RC_IF_ERROR(xoffset < 0 || yoffset < 0 || zoffset < 0,	GL_INVALID_VALUE, RC_RET_VOID);
	RC_IF_ERROR(width < 0 || height < 0 || depth < 0,		GL_INVALID_VALUE, RC_RET_VOID);

	TextureFormat transferFmt = glu::mapGLTransferFormat(format, type);
	RC_IF_ERROR(transferFmt.order	== TextureFormat::CHANNELORDER_LAST ||
				transferFmt.type	== TextureFormat::CHANNELTYPE_LAST, GL_INVALID_ENUM, RC_RET_VOID);

	ConstPixelBufferAccess src = getUnpack3DAccess(transferFmt, width, height, depth, getPixelUnpackPtr(data));

	if (target == GL_TEXTURE_1D && glu::isContextTypeGLCore(m_limits.contextType))
	{
		Texture1D& texture = unit.tex1DBinding ? *unit.tex1DBinding : unit.default1DTex;

		RC_IF_ERROR(!texture.hasLevel(level), GL_INVALID_VALUE, RC_RET_VOID);

		PixelBufferAccess dst = texture.getLevel(level);

		RC_IF_ERROR(xoffset + width		> dst.getWidth()	||
					yoffset + height	> dst.getHeight()	||
					zoffset + depth		> dst.getDepth(),
					GL_INVALID_VALUE, RC_RET_VOID);

		// depth components are limited to [0,1] range
		if (dst.getFormat().order == tcu::TextureFormat::D || dst.getFormat().order == tcu::TextureFormat::DS)
			depthValueFloatClampCopy(tcu::getSubregion(dst, xoffset, yoffset, zoffset, width, height, depth), src);
		else
			tcu::copy(tcu::getSubregion(dst, xoffset, yoffset, zoffset, width, height, depth), src);
	}
	else if (target == GL_TEXTURE_2D)
	{
		Texture2D& texture = unit.tex2DBinding ? *unit.tex2DBinding : unit.default2DTex;

		RC_IF_ERROR(!texture.hasLevel(level), GL_INVALID_VALUE, RC_RET_VOID);

		PixelBufferAccess dst = texture.getLevel(level);

		RC_IF_ERROR(xoffset + width		> dst.getWidth()	||
					yoffset + height	> dst.getHeight()	||
					zoffset + depth		> dst.getDepth(),
					GL_INVALID_VALUE, RC_RET_VOID);

		// depth components are limited to [0,1] range
		if (dst.getFormat().order == tcu::TextureFormat::D || dst.getFormat().order == tcu::TextureFormat::DS)
			depthValueFloatClampCopy(tcu::getSubregion(dst, xoffset, yoffset, zoffset, width, height, depth), src);
		else
			tcu::copy(tcu::getSubregion(dst, xoffset, yoffset, zoffset, width, height, depth), src);
	}
	else if (target == GL_TEXTURE_CUBE_MAP_NEGATIVE_X ||
			 target == GL_TEXTURE_CUBE_MAP_POSITIVE_X ||
			 target == GL_TEXTURE_CUBE_MAP_NEGATIVE_Y ||
			 target == GL_TEXTURE_CUBE_MAP_POSITIVE_Y ||
			 target == GL_TEXTURE_CUBE_MAP_NEGATIVE_Z ||
			 target == GL_TEXTURE_CUBE_MAP_POSITIVE_Z)
	{
		TextureCube&	texture		= unit.texCubeBinding ? *unit.texCubeBinding : unit.defaultCubeTex;
		tcu::CubeFace	face		= mapGLCubeFace(target);

		RC_IF_ERROR(!texture.hasFace(level, face), GL_INVALID_VALUE, RC_RET_VOID);

		PixelBufferAccess dst = texture.getFace(level, face);

		RC_IF_ERROR(xoffset + width		> dst.getWidth()	||
					yoffset + height	> dst.getHeight()	||
					zoffset + depth		> dst.getDepth(),
					GL_INVALID_VALUE, RC_RET_VOID);

		// depth components are limited to [0,1] range
		if (dst.getFormat().order == tcu::TextureFormat::D || dst.getFormat().order == tcu::TextureFormat::DS)
			depthValueFloatClampCopy(tcu::getSubregion(dst, xoffset, yoffset, zoffset, width, height, depth), src);
		else
			tcu::copy(tcu::getSubregion(dst, xoffset, yoffset, zoffset, width, height, depth), src);
	}
	else if (target == GL_TEXTURE_3D)
	{
		Texture3D& texture = unit.tex3DBinding ? *unit.tex3DBinding : unit.default3DTex;

		RC_IF_ERROR(!texture.hasLevel(level), GL_INVALID_VALUE, RC_RET_VOID);

		PixelBufferAccess dst = texture.getLevel(level);

		RC_IF_ERROR(xoffset + width		> dst.getWidth()	||
					yoffset + height	> dst.getHeight()	||
					zoffset + depth		> dst.getDepth(),
					GL_INVALID_VALUE, RC_RET_VOID);

		// depth components are limited to [0,1] range
		if (dst.getFormat().order == tcu::TextureFormat::D || dst.getFormat().order == tcu::TextureFormat::DS)
			depthValueFloatClampCopy(tcu::getSubregion(dst, xoffset, yoffset, zoffset, width, height, depth), src);
		else
			tcu::copy(tcu::getSubregion(dst, xoffset, yoffset, zoffset, width, height, depth), src);
	}
	else if (target == GL_TEXTURE_2D_ARRAY)
	{
		Texture2DArray& texture = unit.tex2DArrayBinding ? *unit.tex2DArrayBinding : unit.default2DArrayTex;

		RC_IF_ERROR(!texture.hasLevel(level), GL_INVALID_VALUE, RC_RET_VOID);

		PixelBufferAccess dst = texture.getLevel(level);

		RC_IF_ERROR(xoffset + width		> dst.getWidth()	||
					yoffset + height	> dst.getHeight()	||
					zoffset + depth		> dst.getDepth(),
					GL_INVALID_VALUE, RC_RET_VOID);

		// depth components are limited to [0,1] range
		if (dst.getFormat().order == tcu::TextureFormat::D || dst.getFormat().order == tcu::TextureFormat::DS)
			depthValueFloatClampCopy(tcu::getSubregion(dst, xoffset, yoffset, zoffset, width, height, depth), src);
		else
			tcu::copy(tcu::getSubregion(dst, xoffset, yoffset, zoffset, width, height, depth), src);
	}
	else if (target == GL_TEXTURE_CUBE_MAP_ARRAY)
	{
		TextureCubeArray& texture = unit.texCubeArrayBinding ? *unit.texCubeArrayBinding : unit.defaultCubeArrayTex;

		RC_IF_ERROR(!texture.hasLevel(level), GL_INVALID_VALUE, RC_RET_VOID);

		PixelBufferAccess dst = texture.getLevel(level);

		RC_IF_ERROR(xoffset + width		> dst.getWidth()	||
					yoffset + height	> dst.getHeight()	||
					zoffset + depth		> dst.getDepth(),
					GL_INVALID_VALUE, RC_RET_VOID);

		// depth components are limited to [0,1] range
		if (dst.getFormat().order == tcu::TextureFormat::D || dst.getFormat().order == tcu::TextureFormat::DS)
			depthValueFloatClampCopy(tcu::getSubregion(dst, xoffset, yoffset, zoffset, width, height, depth), src);
		else
			tcu::copy(tcu::getSubregion(dst, xoffset, yoffset, zoffset, width, height, depth), src);
	}
	else
		RC_ERROR_RET(GL_INVALID_ENUM, RC_RET_VOID);
}